

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

char * __thiscall Fl_Text_Buffer::text_range(Fl_Text_Buffer *this,int start,int end)

{
  int iVar1;
  char *pcVar2;
  char *__dest;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  
  if ((start < 0) || (iVar1 = this->mLength, iVar1 < start)) {
    pcVar2 = (char *)malloc(1);
    __dest = pcVar2;
  }
  else {
    iVar5 = start;
    if (start < end) {
      iVar5 = end;
    }
    if (end < start) {
      start = end;
    }
    if (iVar1 <= iVar5) {
      iVar5 = iVar1;
    }
    iVar6 = iVar5 - start;
    __dest = (char *)malloc((long)(iVar6 + 1));
    iVar1 = this->mGapStart;
    sVar7 = (size_t)iVar6;
    sVar3 = sVar7;
    pcVar2 = __dest;
    if (iVar1 < iVar5) {
      if (start < iVar1) {
        iVar1 = iVar1 - start;
        pcVar4 = this->mBuf;
        memcpy(__dest,pcVar4 + start,(long)iVar1);
        pcVar4 = pcVar4 + this->mGapEnd;
        sVar3 = (long)(iVar6 - iVar1);
        pcVar2 = __dest + iVar1;
      }
      else {
        pcVar4 = this->mBuf + ((long)this->mGapEnd - (long)iVar1) + (long)start;
      }
    }
    else {
      pcVar4 = this->mBuf + start;
    }
    memcpy(pcVar2,pcVar4,sVar3);
    pcVar2 = __dest + sVar7;
  }
  *pcVar2 = '\0';
  return __dest;
}

Assistant:

char *Fl_Text_Buffer::text_range(int start, int end) const {
  IS_UTF8_ALIGNED2(this, (start))
  IS_UTF8_ALIGNED2(this, (end))
  
  char *s = NULL;
  
  /* Make sure start and end are ok, and allocate memory for returned string.
   If start is bad, return "", if end is bad, adjust it. */
  if (start < 0 || start > mLength)
  {
    s = (char *) malloc(1);
    s[0] = '\0';
    return s;
  }
  if (end < start) {
    int temp = start;
    start = end;
    end = temp;
  }
  if (end > mLength)
    end = mLength;
  int copiedLength = end - start;
  s = (char *) malloc(copiedLength + 1);
  
  /* Copy the text from the buffer to the returned string */
  if (end <= mGapStart) {
    memcpy(s, mBuf + start, copiedLength);
  } else if (start >= mGapStart) {
    memcpy(s, mBuf + start + (mGapEnd - mGapStart), copiedLength);
  } else {
    int part1Length = mGapStart - start;
    memcpy(s, mBuf + start, part1Length);
    memcpy(s + part1Length, mBuf + mGapEnd, copiedLength - part1Length);
  }
  s[copiedLength] = '\0';
  return s;
}